

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::AddKel
          (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  TPZFrontNonSym<double> *this_00;
  int64_t iVar2;
  ostream *GlobalSize;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this_01;
  TPZBaseMatrix *in_RDI;
  lock_guard<std::mutex> lock;
  TPZEqnArray<double> *AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  mutex_type *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  TPZEqnArray<double> *in_stack_ffffffffffffff88;
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>
  *in_stack_ffffffffffffff90;
  int64_t *in_stack_ffffffffffffff98;
  int64_t *in_stack_ffffffffffffffa0;
  TPZEqnArray<double> *in_stack_ffffffffffffffb0;
  TPZVec<long> *in_stack_ffffffffffffffb8;
  TPZVec<long> *in_stack_ffffffffffffffc0;
  TPZFMatrix<double> *in_stack_ffffffffffffffc8;
  TPZFrontNonSym<double> *in_stack_ffffffffffffffd0;
  long local_28;
  
  TPZFrontNonSym<double>::AddKel
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::EquationsToDecompose
            ((TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)
             in_stack_ffffffffffffffb0,(TPZVec<long> *)in_RDI,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  if (local_28 <= (long)in_stack_ffffffffffffffd0) {
    this_00 = (TPZFrontNonSym<double> *)operator_new(0x3290);
    TPZEqnArray<double>::TPZEqnArray(in_stack_ffffffffffffffb0);
    TPZFrontNonSym<double>::DecomposeEquations
              (this_00,(int64_t)in_stack_ffffffffffffff98,(int64_t)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::CheckCompress
              (in_stack_ffffffffffffff90);
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZStack<TPZEqnArray<double>_*,_10>::Push
              ((TPZStack<TPZEqnArray<double>_*,_10> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (in_stack_ffffffffffffffd0 == (TPZFrontNonSym<double> *)(iVar2 + -1)) {
      GlobalSize = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      this_01 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)
                std::operator<<(GlobalSize,"Decomposition finished");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      FinishWriting(this_01);
      TPZFrontNonSym<double>::Reset(in_stack_ffffffffffffffd0,(int64_t)GlobalSize);
    }
    std::condition_variable::notify_all();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d3de7b);
  }
  DVar1 = TPZFront<double>::GetDecomposeType((TPZFront<double> *)&in_RDI[6].fDecomposed);
  in_RDI->fDecomposed = (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	this->fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_DEBUG(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);

	if(maxeq >= mineq) {
		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;

		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        std::lock_guard<std::mutex> lock(fwritelock);
		fEqnStack.Push(AuxEqn);
		if(maxeq == this->Rows()-1){
            //check if writeing is over and closes file
			cout << endl << "Decomposition finished" << endl;
			cout.flush();
			FinishWriting();
			this->fFront.Reset(0);
			//fStorage.ReOpen();
		}
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}